

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall
PPointer::SetPointer
          (PPointer *this,void *base,uint offset,TArray<unsigned_long,_unsigned_long> *special)

{
  bool bVar1;
  ulong local_30;
  TArray<unsigned_long,_unsigned_long> *local_28;
  TArray<unsigned_long,_unsigned_long> *special_local;
  void *pvStack_18;
  uint offset_local;
  void *base_local;
  PPointer *this_local;
  
  if ((this->PointedType != (PType *)0x0) &&
     (local_28 = special, special_local._4_4_ = offset, pvStack_18 = base, base_local = this,
     bVar1 = DObject::IsKindOf((DObject *)this->PointedType,PClass::RegistrationInfo.MyClass), bVar1
     )) {
    local_30 = (ulong)special_local._4_4_;
    TArray<unsigned_long,_unsigned_long>::Push(local_28,&local_30);
  }
  return;
}

Assistant:

void PPointer::SetPointer(void *base, unsigned offset, TArray<size_t> *special) const
{
	if (PointedType != nullptr && PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
	{
		// Add to the list of pointers for this class.
		special->Push(offset);
	}
}